

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O1

void __thiscall pg::TSPMSolver::update(TSPMSolver *this,int pl)

{
  int d;
  int *piVar1;
  int *piVar2;
  char cVar3;
  bool bVar4;
  ulong uVar5;
  Game *pGVar6;
  ostream *poVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  int *piVar12;
  int to;
  int iVar13;
  int *piVar14;
  int m;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_90;
  uint local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  long local_38;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  local_90 = 0;
  lVar9 = (long)pl;
  local_8c = pl;
  if (0 < ((this->super_Solver).game)->n_vertices) {
    uVar5 = 0;
    do {
      if (((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) &&
         ((this->unstable[uVar5] = 0, this->pms[this->k * (long)local_90 + lVar9] == -1 ||
          (bVar4 = canlift(this,local_90,local_8c), bVar4)))) {
        this->unstable[local_90] = 1;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                    ((deque<int,std::allocator<int>> *)&local_88,&local_90);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      uVar5 = (long)local_90 + 1;
      local_90 = (int)uVar5;
    } while ((long)uVar5 < ((this->super_Solver).game)->n_vertices);
  }
  local_38 = lVar9;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar13 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      pGVar6 = (this->super_Solver).game;
      piVar14 = pGVar6->_inedges;
      iVar13 = pGVar6->_firstins[iVar13];
      if (piVar14[iVar13] != -1) {
        piVar14 = piVar14 + iVar13;
        do {
          local_90 = *piVar14;
          uVar5 = (ulong)local_90;
          if (((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) &&
             (this->unstable[uVar5] == 0)) {
            pGVar6 = (this->super_Solver).game;
            if ((((pGVar6->_owner)._bits[uVar5 >> 6] & 1L << (uVar5 & 0x3f)) != 0) != local_8c) {
              iVar13 = pGVar6->_outedges[pGVar6->_firstouts[uVar5]];
              if (iVar13 != -1) {
                d = pGVar6->_priority[uVar5];
                piVar12 = pGVar6->_outedges + pGVar6->_firstouts[uVar5];
                iVar8 = -1;
                do {
                  uVar5 = (ulong)iVar13;
                  if (((((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1)
                         == 0) && (this->unstable[uVar5] == 0)) &&
                      ((Prog(this,this->tmp,this->pms + uVar5 * this->k,d,local_8c), iVar8 == -1 ||
                       (bVar4 = pm_less(this,this->tmp,this->best,d,local_8c), bVar4)))) &&
                     (lVar9 = this->k, iVar8 = iVar13, 0 < lVar9)) {
                    piVar1 = this->tmp;
                    piVar2 = this->best;
                    lVar10 = 0;
                    do {
                      piVar2[lVar10] = piVar1[lVar10];
                      lVar10 = lVar10 + 1;
                    } while (lVar9 != lVar10);
                  }
                  iVar13 = piVar12[1];
                  piVar12 = piVar12 + 1;
                } while (iVar13 != -1);
                if ((iVar8 != -1) &&
                   (bVar4 = pm_less(this,this->pms + (long)local_90 * this->k,this->best,d,local_8c)
                   , !bVar4)) goto LAB_0016ebd6;
              }
            }
            this->unstable[local_90] = 1;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_88,&local_90);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
LAB_0016ebd6:
          piVar12 = piVar14 + 1;
          piVar14 = piVar14 + 1;
        } while (*piVar12 != -1);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  pGVar6 = (this->super_Solver).game;
  if (0 < pGVar6->n_vertices) {
    uVar5 = 0;
    do {
      if (((((this->super_Solver).disabled)->_bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0) &&
         (this->unstable[uVar5] == 0)) {
        piVar14 = this->pms;
        lVar9 = this->k * uVar5 - local_38;
        if (piVar14[lVar9 + 1] != -1) {
          if ((pGVar6->_priority[uVar5] & 1U) != local_8c) {
            this->counts[pGVar6->_priority[uVar5]] = this->counts[pGVar6->_priority[uVar5]] + -1;
          }
          piVar14[lVar9 + 1] = -1;
          todo_push(this,(int)uVar5);
          if ((this->super_Solver).trace != 0) {
            poVar7 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\x1b[1;33mupdated node ",0x14);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"/",1);
            poVar7 = (ostream *)
                     std::ostream::operator<<(poVar7,((this->super_Solver).game)->_priority[uVar5]);
            bVar4 = ((((this->super_Solver).game)->_owner)._bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1)
                    != 0;
            pcVar11 = " (odd)";
            if (!bVar4) {
              pcVar11 = " (even)";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar11,7 - (ulong)bVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m to",6);
            pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar5);
            poVar7 = (this->super_Solver).logger;
            cVar3 = (char)poVar7;
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
          }
        }
      }
      uVar5 = uVar5 + 1;
      pGVar6 = (this->super_Solver).game;
    } while ((long)uVar5 < pGVar6->n_vertices);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void
TSPMSolver::update(int pl)
{
    std::queue<int> q;

    // find unstable nodes (for measure <pl>)
    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        unstable[i] = 0; // first mark as stable
        if (pms[k*i + pl] == -1 or canlift(i, pl)) {
            unstable[i] = 1;
            q.push(i);
        }
    }

    while (!q.empty()) {
        int n = q.front();
        q.pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int m = *curedge;
            if (disabled[m] or unstable[m]) continue;
            if (owner(m) != pl) {
                int best_to = -1;
                const int d = priority(m);
                for (auto curedge = outs(m); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (disabled[to]) continue;
                    if (unstable[to]) continue;
                    Prog(tmp, pms + k*to, d, pl);
                    if (best_to == -1 or pm_less(tmp, best, d, pl)) {
                        for (int i=0; i<k; i++) best[i] = tmp[i];
                        best_to = to;
                    }
                }
                if (best_to != -1 and !pm_less(pms+k*m, best, d, pl)) continue;
            }
            unstable[m] = 1;
            q.push(m);
        }
    }

    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        if (unstable[i] == 0 and pms[k*i + 1-pl] != -1) {
            if ((priority(i)&1) != pl) counts[priority(i)]--;
            pms[k*i + 1-pl] = -1;
            todo_push(i);

            if (trace) {
                logger << "\033[1;33mupdated node " << i << "/" << priority(i) << (owner(i)?" (odd)":" (even)") << "\033[m to";
                pm_stream(logger, pms + i*k);
                logger << std::endl;
            }
        }
    }
}